

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

shared_ptr<BER_CONTAINER> __thiscall IntegerCallback::buildTypeWithValue(IntegerCallback *this)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  SortableOIDType *pSVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined **in_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar6;
  
  puVar4 = *(undefined4 **)(in_RSI + 0x18);
  if (puVar4 == (undefined4 *)0x0) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  }
  else {
    pSVar5 = (SortableOIDType *)operator_new(0x28);
    (pSVar5->super_OIDType).super_BER_CONTAINER._type = 1;
    (pSVar5->super_OIDType).super_BER_CONTAINER._length = 1;
    (pSVar5->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00115798;
    uVar1 = *puVar4;
    (pSVar5->super_OIDType)._value._M_dataplus._M_p = (pointer)0x2;
    in_RDX = &PTR__BER_CONTAINER_00115578;
    *(undefined ***)&(pSVar5->super_OIDType).valid = &PTR__BER_CONTAINER_00115578;
    *(undefined4 *)&(pSVar5->super_OIDType)._value._M_string_length = uVar1;
    iVar2 = *(int *)(in_RSI + 0x20);
    if (iVar2 != 0) {
      iVar3 = (int)(pSVar5->super_OIDType)._value._M_string_length;
      in_RDX = (undefined **)((long)iVar3 % (long)iVar2 & 0xffffffff);
      *(int *)&(pSVar5->super_OIDType)._value._M_string_length = iVar3 / iVar2;
    }
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&(pSVar5->super_OIDType).valid;
    (this->super_ValueCallback).OID = pSVar5;
  }
  sVar6.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  sVar6.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar6.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> IntegerCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    auto val = std::make_shared<IntegerType>(*this->value);
    if(this->modifier != 0){
        // Apple local division if callback was asked to
        val->_value /= this->modifier;
    }
    return val;
}